

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *rhs)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_58;
  
  if ((this->l).updateType == 0) {
    solveUpdateLeft(this,rhs);
    solveUleft(this,vec,rhs);
  }
  else {
    solveUleft(this,vec,rhs);
    local_58.m_backend.fpclass = cpp_dec_float_finite;
    local_58.m_backend.prec_elem = 10;
    local_58.m_backend.data._M_elems[0] = 0;
    local_58.m_backend.data._M_elems[1] = 0;
    local_58.m_backend.data._M_elems[2] = 0;
    local_58.m_backend.data._M_elems[3] = 0;
    local_58.m_backend.data._M_elems[4] = 0;
    local_58.m_backend.data._M_elems[5] = 0;
    local_58.m_backend.data._M_elems._24_5_ = 0;
    local_58.m_backend.data._M_elems[7]._1_3_ = 0;
    local_58.m_backend.data._M_elems._32_5_ = 0;
    local_58.m_backend._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,0.0);
    solveLleftForest(this,vec,(int *)0x0,&local_58);
  }
  solveLleft(this,vec);
  return;
}

Assistant:

void CLUFactor<R>::solveLeft(R* vec, R* rhs)
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      solveUpdateLeft(rhs);
      solveUleft(vec, rhs);
      solveLleft(vec);
   }
   else
   {
      solveUleft(vec, rhs);
      //@todo is 0.0 the right value for eps here ?
      solveLleftForest(vec, nullptr, 0.0);
      solveLleft(vec);
   }
}